

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::ParameterizedTestFactory<P256NistzSelectImplTest_SelectW7_Test>::CreateTest
          (ParameterizedTestFactory<P256NistzSelectImplTest_SelectW7_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<P256NistzSelectImpl>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_006ff7f0;
  this_00[1]._vptr_Test = (_func_int **)&PTR__P256NistzSelectImplTest_SelectW7_Test_006ff830;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }